

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int UTF8ToUTF8(uchar *out,int *outlen,uchar *inb,int *inlenb)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = -1;
  if (inlenb != (int *)0x0 && (outlen != (int *)0x0 && out != (uchar *)0x0)) {
    if (inb == (uchar *)0x0) {
      iVar1 = 0;
      *outlen = 0;
      *inlenb = 0;
    }
    else {
      uVar2 = *inlenb;
      if (*outlen < *inlenb) {
        uVar2 = *outlen;
      }
      if (-1 < (int)uVar2) {
        memcpy(out,inb,(ulong)uVar2);
        *outlen = uVar2;
        *inlenb = uVar2;
        iVar1 = *outlen;
      }
    }
  }
  return iVar1;
}

Assistant:

static int
UTF8ToUTF8(unsigned char* out, int *outlen,
           const unsigned char* inb, int *inlenb)
{
    int len;

    if ((out == NULL) || (outlen == NULL) || (inlenb == NULL))
	return(-1);
    if (inb == NULL) {
        /* inb == NULL means output is initialized. */
        *outlen = 0;
        *inlenb = 0;
        return(0);
    }
    if (*outlen > *inlenb) {
	len = *inlenb;
    } else {
	len = *outlen;
    }
    if (len < 0)
	return(-1);

    memcpy(out, inb, len);

    *outlen = len;
    *inlenb = len;
    return(*outlen);
}